

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O0

value * mjs::anon_unknown_63::array_concat
                  (value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                  value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  value_type vVar2;
  global_object *pgVar3;
  reference this;
  object_ptr *e;
  value *item;
  const_iterator __end2;
  const_iterator __begin2;
  vector<mjs::value,_std::allocator<mjs::value>_> *__range2;
  object_ptr local_78;
  anon_class_8_1_2a3436f3 local_68;
  anon_class_8_1_2a3436f3 add_object;
  anon_class_24_3_4e94b03e add_value;
  undefined1 local_40 [4];
  uint32_t n;
  object_ptr a;
  gc_heap *h;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  value *this__local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  a.super_gc_heap_ptr_untyped._8_8_ = gc_heap_ptr_untyped::heap(&global->super_gc_heap_ptr_untyped);
  make_array((mjs *)local_40,global,0);
  add_value.n._4_4_ = 0;
  add_value.a = (object_ptr *)a.super_gc_heap_ptr_untyped._8_8_;
  add_value.h = (gc_heap *)((long)&add_value.n + 4);
  local_68.add_value = (anon_class_24_3_4e94b03e *)&add_object;
  add_object.add_value = (anon_class_24_3_4e94b03e *)local_40;
  pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar3->super_object)._vptr_object[0x11])(&local_78,pgVar3,this_);
  array_concat::anon_class_8_1_2a3436f3::operator()(&local_68,&local_78);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_78);
  __end2 = std::vector<mjs::value,_std::allocator<mjs::value>_>::begin(args);
  item = (value *)std::vector<mjs::value,_std::allocator<mjs::value>_>::end(args);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
                                *)&item);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<const_mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
           ::operator*(&__end2);
    vVar2 = value::type(this);
    if (vVar2 == object) {
      e = value::object_value(this);
      array_concat::anon_class_8_1_2a3436f3::operator()(&local_68,e);
    }
    else {
      array_concat::anon_class_24_3_4e94b03e::operator()
                ((anon_class_24_3_4e94b03e *)&add_object,this);
    }
    __gnu_cxx::
    __normal_iterator<const_mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>::
    operator++(&__end2);
  }
  value::value(__return_storage_ptr__,(object_ptr *)local_40);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

value array_concat(gc_heap_ptr<global_object> global, const value& this_, const std::vector<value>& args) {
    auto& h = global.heap();
    auto a = make_array(global, 0);
    uint32_t n = 0;

    auto add_value = [&](const value& e) {
        a->put(string{h, index_string(n++)}, e);
    };

    auto add_object = [&](const object_ptr& e) {
        if (is_array(e)) {
            const uint32_t l = to_uint32(e->get(L"length"));
            for (uint32_t k = 0; k < l; ++k) {
                const auto is = index_string(k);
                if (e->has_property(is)) {
                    add_value(e->get(is));
                }
            }
        } else {
            add_value(value{e});
        }
    };

    add_object(global->to_object(this_));

    for (const auto& item: args) {
        if (item.type() == value_type::object) {
            add_object(item.object_value());
        } else {
            add_value(item);
        }
    }

    return value{a};
}